

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedMeshControl.cpp
# Opt level: O0

void __thiscall TPZMHMixedMeshControl::BuildMultiPhysicsMesh(TPZMHMixedMeshControl *this)

{
  bool bVar1;
  int64_t iVar2;
  TPZCompMesh *pTVar3;
  TPZCompMesh **ppTVar4;
  reference ppVar5;
  TPZGeoEl *pTVar6;
  long *plVar7;
  TPZMultiphysicsCompMesh *this_00;
  TPZVec<TPZCompMesh_*> *mesh_vector;
  long in_RDI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar8;
  size_t in_stack_00000038;
  char *in_stack_00000040;
  int64_t el_3;
  TPZStack<long,_10> gelindexes;
  TPZGeoEl *fat;
  TPZGeoEl *gel_2;
  int64_t el_2;
  TPZGeoEl *gel_1;
  TPZCompEl *cel_1;
  int64_t el_1;
  TPZGeoEl *gel;
  TPZCompEl *cel;
  int64_t el;
  int64_t nel;
  pair<const_int,_TPZMaterial_*> it;
  iterator __end1;
  iterator __begin1;
  map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
  *__range1;
  set<int,_std::less<int>,_std::allocator<int>_> matids;
  TPZManVector<long,_10> shouldcreate;
  TPZManVector<TPZCompMesh_*,_10> meshvec;
  int vecsize;
  TPZMultiphysicsCompMesh *mphysics;
  map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
  *in_stack_fffffffffffffc18;
  TPZCompMesh *in_stack_fffffffffffffc20;
  TPZCompEl *in_stack_fffffffffffffc28;
  TPZStack<long,_10> *in_stack_fffffffffffffc30;
  value_type_conflict4 *in_stack_fffffffffffffc38;
  TPZManVector<TPZCompMesh_*,_10> *in_stack_fffffffffffffc40;
  int64_t in_stack_fffffffffffffc48;
  TPZManVector<long,_10> *in_stack_fffffffffffffc50;
  TPZCompMesh *in_stack_fffffffffffffcb0;
  undefined8 local_288;
  int64_t local_270;
  TPZCompMesh *local_1f8;
  int64_t local_1e8;
  _Self local_1e0;
  int local_1d4;
  _Self local_1d0;
  TPZGeoEl *local_1c8;
  TPZCompEl *local_1c0;
  long local_1b8;
  _Self local_1b0;
  int local_1a4;
  _Self local_1a0;
  TPZGeoEl *local_198;
  TPZCompEl *local_190;
  long local_188;
  TPZVec<TPZCompMesh_*> *local_180;
  _Base_ptr local_178;
  undefined1 local_170;
  undefined8 local_168;
  TPZMaterial *pTStack_160;
  _Self local_158;
  _Self local_150;
  map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
  *local_148;
  undefined8 local_110;
  TPZVec<long> local_108 [4];
  TPZVec<TPZCompMesh_*> local_88 [3];
  undefined4 local_14;
  undefined8 local_10;
  
  TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x10));
  iVar2 = TPZCompMesh::NElements((TPZCompMesh *)0x1f60560);
  if (iVar2 != 0) {
    pzinternal::DebugStopImpl(in_stack_00000040,in_stack_00000038);
  }
  TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x10));
  TPZCompMesh::SetAllCreateFunctionsMultiphysicElem((TPZCompMesh *)0x1f60590);
  pTVar3 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x10));
  if (pTVar3 == (TPZCompMesh *)0x0) {
    local_288 = 0;
  }
  else {
    local_288 = __dynamic_cast(pTVar3,&TPZCompMesh::typeinfo,&TPZMultiphysicsCompMesh::typeinfo,0);
  }
  local_10 = local_288;
  local_14 = 2;
  if (1 < *(int *)(in_RDI + 0x34)) {
    local_14 = 3;
  }
  TPZManVector<TPZCompMesh_*,_10>::TPZManVector
            (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38);
  pTVar3 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x1e8));
  ppTVar4 = TPZVec<TPZCompMesh_*>::operator[](local_88,0);
  *ppTVar4 = pTVar3;
  pTVar3 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x28));
  ppTVar4 = TPZVec<TPZCompMesh_*>::operator[](local_88,1);
  *ppTVar4 = pTVar3;
  if (1 < *(int *)(in_RDI + 0x34)) {
    pTVar3 = TPZAutoPointer<TPZCompMesh>::operator->
                       ((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x1f0));
    ppTVar4 = TPZVec<TPZCompMesh_*>::operator[](local_88,2);
    *ppTVar4 = pTVar3;
  }
  TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 8));
  TPZGeoMesh::NElements((TPZGeoMesh *)0x1f60761);
  local_110 = 0;
  TPZManVector<long,_10>::TPZManVector
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,(long *)in_stack_fffffffffffffc40);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1f607a3);
  pTVar3 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x10));
  local_148 = TPZCompMesh::MaterialVec(pTVar3);
  local_150._M_node =
       (_Base_ptr)
       std::
       map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
       ::begin(in_stack_fffffffffffffc18);
  local_158._M_node =
       (_Base_ptr)
       std::
       map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
       ::end(in_stack_fffffffffffffc18);
  while (bVar1 = std::operator!=(&local_150,&local_158), bVar1) {
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_TPZMaterial_*>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_int,_TPZMaterial_*>_> *)
                        in_stack_fffffffffffffc20);
    local_168 = *(undefined8 *)ppVar5;
    pTStack_160 = ppVar5->second;
    pVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffc40,
                       in_stack_fffffffffffffc38);
    local_178 = (_Base_ptr)pVar8.first._M_node;
    local_170 = pVar8.second;
    std::_Rb_tree_iterator<std::pair<const_int,_TPZMaterial_*>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_int,_TPZMaterial_*>_> *)in_stack_fffffffffffffc20)
    ;
  }
  TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x1e8));
  local_180 = (TPZVec<TPZCompMesh_*> *)TPZCompMesh::NElements((TPZCompMesh *)0x1f608df);
  for (local_188 = 0; local_188 < (long)local_180; local_188 = local_188 + 1) {
    TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x1e8));
    local_190 = TPZCompMesh::Element(in_stack_fffffffffffffc20,(int64_t)in_stack_fffffffffffffc18);
    local_198 = TPZCompEl::Reference(in_stack_fffffffffffffc28);
    local_1a4 = TPZGeoEl::MaterialId(local_198);
    local_1a0._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::find
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffc28,
                    (key_type *)in_stack_fffffffffffffc20);
    local_1b0._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::end
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffc18);
    bVar1 = std::operator==(&local_1a0,&local_1b0);
    if (bVar1) {
      pzinternal::DebugStopImpl(in_stack_00000040,in_stack_00000038);
    }
    if (local_190 != (TPZCompEl *)0x0) {
      pTVar6 = TPZCompEl::Reference(in_stack_fffffffffffffc28);
      iVar2 = TPZGeoEl::Index(pTVar6);
      plVar7 = TPZVec<long>::operator[](local_108,iVar2);
      *plVar7 = 1;
    }
  }
  this_00 = (TPZMultiphysicsCompMesh *)
            TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x28));
  mesh_vector = (TPZVec<TPZCompMesh_*> *)TPZCompMesh::NElements((TPZCompMesh *)0x1f60ad1);
  local_180 = mesh_vector;
  for (local_1b8 = 0; local_1b8 < (long)local_180; local_1b8 = local_1b8 + 1) {
    in_stack_fffffffffffffcb0 =
         TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x28));
    local_1c0 = TPZCompMesh::Element(in_stack_fffffffffffffc20,(int64_t)in_stack_fffffffffffffc18);
    local_1c8 = TPZCompEl::Reference(in_stack_fffffffffffffc28);
    local_1d4 = TPZGeoEl::MaterialId(local_1c8);
    local_1d0._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::find
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffc28,
                    (key_type *)in_stack_fffffffffffffc20);
    local_1e0._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::end
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffc18);
    bVar1 = std::operator==(&local_1d0,&local_1e0);
    if (bVar1) {
      pzinternal::DebugStopImpl(in_stack_00000040,in_stack_00000038);
    }
    if (local_1c0 != (TPZCompEl *)0x0) {
      pTVar6 = TPZCompEl::Reference(in_stack_fffffffffffffc28);
      iVar2 = TPZGeoEl::Index(pTVar6);
      plVar7 = TPZVec<long>::operator[](local_108,iVar2);
      *plVar7 = 1;
    }
  }
  TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 8));
  local_180 = (TPZVec<TPZCompMesh_*> *)TPZGeoMesh::NElements((TPZGeoMesh *)0x1f60ca2);
  for (local_1e8 = 0; local_1e8 < (long)local_180; local_1e8 = local_1e8 + 1) {
    TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 8));
    TPZGeoMesh::Element((TPZGeoMesh *)in_stack_fffffffffffffc20,(int64_t)in_stack_fffffffffffffc18);
    plVar7 = TPZVec<long>::operator[](local_108,local_1e8);
    if (*plVar7 != 0) {
      local_1f8 = (TPZCompMesh *)TPZGeoEl::Father((TPZGeoEl *)in_stack_fffffffffffffc20);
      while (local_1f8 != (TPZCompMesh *)0x0) {
        iVar2 = TPZGeoEl::Index((TPZGeoEl *)local_1f8);
        plVar7 = TPZVec<long>::operator[](local_108,iVar2);
        if (*plVar7 == 1) {
          in_stack_fffffffffffffc30 = (TPZStack<long,_10> *)TPZGeoEl::Index((TPZGeoEl *)local_1f8);
          in_stack_fffffffffffffc28 =
               (TPZCompEl *)TPZVec<long>::operator[](local_108,(int64_t)in_stack_fffffffffffffc30);
          *(long *)in_stack_fffffffffffffc28 = 0;
        }
        in_stack_fffffffffffffc20 =
             (TPZCompMesh *)TPZGeoEl::Father((TPZGeoEl *)in_stack_fffffffffffffc20);
        local_1f8 = in_stack_fffffffffffffc20;
      }
    }
  }
  TPZStack<long,_10>::TPZStack(in_stack_fffffffffffffc30);
  for (local_270 = 0; local_270 < (long)local_180; local_270 = local_270 + 1) {
    plVar7 = TPZVec<long>::operator[](local_108,local_270);
    if (*plVar7 != 0) {
      TPZStack<long,_10>::Push(in_stack_fffffffffffffc30,(long)in_stack_fffffffffffffc28);
    }
  }
  TPZMultiphysicsCompMesh::BuildMultiphysicsSpace
            (this_00,mesh_vector,(TPZVec<long> *)in_stack_fffffffffffffcb0);
  TPZStack<long,_10>::~TPZStack((TPZStack<long,_10> *)0x1f60efa);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1f60f07);
  TPZManVector<long,_10>::~TPZManVector((TPZManVector<long,_10> *)in_stack_fffffffffffffc20);
  TPZManVector<TPZCompMesh_*,_10>::~TPZManVector
            ((TPZManVector<TPZCompMesh_*,_10> *)in_stack_fffffffffffffc20);
  return;
}

Assistant:

void TPZMHMixedMeshControl::BuildMultiPhysicsMesh()
{
    if (fCMesh->NElements() != 0) {
        DebugStop();
    }
    fCMesh->SetAllCreateFunctionsMultiphysicElem();
    TPZMultiphysicsCompMesh *mphysics = dynamic_cast<TPZMultiphysicsCompMesh *>(fCMesh.operator->());
    int vecsize = 2;
    if(fNState > 1) vecsize = 3;
    TPZManVector<TPZCompMesh *> meshvec(vecsize);
    meshvec[0] = fFluxMesh.operator->();
    meshvec[1] = fPressureFineMesh.operator->();
    if(fNState > 1)
    {
        meshvec[2] = this->fRotationMesh.operator->();
    }
    TPZManVector<int64_t> shouldcreate(fGMesh->NElements(),0);
    std::set<int> matids;
    for (auto it : fCMesh->MaterialVec()) {
        matids.insert(it.first);
    }
    int64_t nel = fFluxMesh->NElements();
    for (int64_t el = 0; el<nel; el++) {
        TPZCompEl *cel = fFluxMesh->Element(el);
        TPZGeoEl *gel = cel->Reference();
        // this means that all geometric elements associated with flux elements will generate a computational element
        if (matids.find(gel->MaterialId()) == matids.end()) {
            DebugStop();
        }
        if (cel) {
            shouldcreate[cel->Reference()->Index()] = 1;
        }
    }
    nel = fPressureFineMesh->NElements();
    for (int64_t el=0; el<nel; el++) {
        TPZCompEl *cel = fPressureFineMesh->Element(el);
        TPZGeoEl *gel = cel->Reference();
        if (matids.find(gel->MaterialId()) == matids.end()) {
            DebugStop();
        }
        if (cel) {
            shouldcreate[cel->Reference()->Index()] = 1;
        }
    }
    // define the intersection of the finest references
    nel = fGMesh->NElements();
    for (int64_t el=0; el<nel; el++) {
        TPZGeoEl *gel = fGMesh->Element(el);
        if (shouldcreate[el])
        {
            TPZGeoEl *fat = gel->Father();
            while(fat)
            {
                if(shouldcreate[fat->Index()] == 1)
                {
                    shouldcreate[fat->Index()] = 0;
                }
                fat = fat->Father();
            }
        }
    }
    TPZStack<int64_t> gelindexes;
    for (int64_t el=0; el<nel; el++) {
        if (shouldcreate[el])
        {
            gelindexes.Push(el);
        }
    }
#ifdef PZ_LOG
    if(logger.isDebugEnabled())
    {
        std::stringstream sout;
        sout << "Geometric indices for which we will create multiphysics elements" << std::endl;
        sout << gelindexes;
//        std::cout << sout.str() << std::endl;
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    mphysics->BuildMultiphysicsSpace(meshvec,gelindexes);

}